

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O1

void __thiscall lsim::gui::CircuitEditor::draw_grid(CircuitEditor *this,ImDrawList *draw_list)

{
  ImVec2 IVar1;
  Point PVar2;
  float fVar3;
  Point win_pos;
  Point local_80;
  ImVec2 local_78;
  Point local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  CircuitEditor *local_48;
  Point local_40;
  Point local_38;
  
  if (this->m_show_grid == true) {
    IVar1 = ImGui::GetCursorScreenPos();
    Point::Point(&local_70,IVar1.x,IVar1.y);
    IVar1 = ImGui::GetWindowSize();
    Point::Point(&local_80,IVar1.x,IVar1.y);
    local_58 = local_80.x;
    fStack_54 = local_80.y;
    uStack_50 = 0;
    local_48 = this;
    fVar3 = fmodf((this->m_scroll_delta).x,10.0);
    local_68 = fStack_54;
    fStack_64 = fStack_54;
    fStack_60 = fStack_54;
    fStack_5c = fStack_54;
    if (fVar3 < local_58) {
      do {
        Point::Point(&local_38,fVar3,0.0);
        PVar2 = Point::operator+(&local_38,&local_70);
        local_80.x = PVar2.x;
        local_80.y = PVar2.y;
        Point::Point(&local_40,fVar3,local_68);
        PVar2 = Point::operator+(&local_40,&local_70);
        local_78.x = PVar2.x;
        local_78.y = PVar2.y;
        ImDrawList::AddLine(draw_list,(ImVec2 *)&local_80,&local_78,0x28c8c8c8,1.0);
        fVar3 = fVar3 + 10.0;
      } while (fVar3 < local_58);
    }
    fVar3 = fmodf((local_48->m_scroll_delta).y,10.0);
    if (fVar3 < local_68) {
      do {
        Point::Point(&local_38,0.0,fVar3);
        PVar2 = Point::operator+(&local_38,&local_70);
        local_80.x = PVar2.x;
        local_80.y = PVar2.y;
        Point::Point(&local_40,local_58,fVar3);
        PVar2 = Point::operator+(&local_40,&local_70);
        local_78.x = PVar2.x;
        local_78.y = PVar2.y;
        ImDrawList::AddLine(draw_list,(ImVec2 *)&local_80,&local_78,0x28c8c8c8,1.0);
        fVar3 = fVar3 + 10.0;
      } while (fVar3 < local_68);
    }
  }
  return;
}

Assistant:

void CircuitEditor::draw_grid(ImDrawList *draw_list) {
	if (!m_show_grid) {
		return;
	}

	Point win_pos = ImGui::GetCursorScreenPos();
	Point win_size = ImGui::GetWindowSize();

	for (float x = fmodf(m_scroll_delta.x, GRID_SIZE); x < win_size.x; x += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(x, 0.0f) + win_pos, Point(x, win_size.y) + win_pos, COLOR_GRID_LINE);
	}

	for (float y = fmodf(m_scroll_delta.y, GRID_SIZE); y < win_size.y; y += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(0.0f, y) + win_pos, Point(win_size.x, y) + win_pos, COLOR_GRID_LINE);
	}
}